

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBox.cpp
# Opt level: O2

void __thiscall
chrono::geometry::ChBox::GetBoundingBox
          (ChBox *this,ChVector<double> *cmin,ChVector<double> *cmax,ChMatrix33<double> *rot)

{
  undefined1 auVar1 [16];
  pointer v;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  initializer_list<chrono::ChVector<double>_> __l;
  Transpose<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_> local_118;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> vertices;
  ChVector<double> p;
  
  p.m_data[2] = (this->Size).m_data[2];
  p.m_data[0] = (this->Size).m_data[0];
  p.m_data[1] = (this->Size).m_data[1];
  auVar2._0_8_ = -p.m_data[2];
  auVar2._8_8_ = 0x8000000000000000;
  vmovlpd_avx(auVar2);
  vmovlpd_avx(auVar2);
  vmovlpd_avx(auVar2);
  vmovlpd_avx(auVar2);
  __l._M_len = 8;
  __l._M_array = &p;
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::vector
            (&vertices,__l,(allocator_type *)&local_118);
  cmin->m_data[0] = 1.79769313486232e+308;
  cmin->m_data[1] = 1.79769313486232e+308;
  cmin->m_data[2] = 1.79769313486232e+308;
  cmax->m_data[0] = -1.79769313486232e+308;
  cmax->m_data[1] = -1.79769313486232e+308;
  cmax->m_data[2] = -1.79769313486232e+308;
  v = vertices.
      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start;
  while (v != vertices.
              super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
    local_118.m_matrix = &rot->super_Matrix<double,_3,_3,_1,_3,_3>;
    chrono::operator*(&local_118,v);
    auVar1._8_8_ = p.m_data[1];
    auVar1._0_8_ = p.m_data[0];
    v = v + 1;
    auVar2 = vminpd_avx(*(undefined1 (*) [16])cmin->m_data,auVar1);
    *(undefined1 (*) [16])cmin->m_data = auVar2;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = cmin->m_data[2];
    auVar5._8_8_ = 0;
    auVar5._0_8_ = p.m_data[2];
    auVar2 = vminsd_avx(auVar3,auVar5);
    cmin->m_data[2] = auVar2._0_8_;
    auVar2 = vmaxpd_avx(*(undefined1 (*) [16])cmax->m_data,auVar1);
    *(undefined1 (*) [16])cmax->m_data = auVar2;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = cmax->m_data[2];
    auVar2 = vmaxsd_avx(auVar4,auVar5);
    cmax->m_data[2] = auVar2._0_8_;
  }
  std::_Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::
  ~_Vector_base(&vertices.
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               );
  return;
}

Assistant:

void ChBox::GetBoundingBox(ChVector<>& cmin, ChVector<>& cmax, const ChMatrix33<>& rot) const {
    std::vector<ChVector<>> vertices{GetP1(), GetP2(), GetP3(), GetP4(), GetP5(), GetP6(), GetP7(), GetP8()};

    cmin = ChVector<>(+std::numeric_limits<double>::max());
    cmax = ChVector<>(-std::numeric_limits<double>::max());

    for (const auto& v : vertices) {
        auto p = rot.transpose() * v;

        cmin.x() = ChMin(cmin.x(), p.x());
        cmin.y() = ChMin(cmin.y(), p.y());
        cmin.z() = ChMin(cmin.z(), p.z());

        cmax.x() = ChMax(cmax.x(), p.x());
        cmax.y() = ChMax(cmax.y(), p.y());
        cmax.z() = ChMax(cmax.z(), p.z());
    }
}